

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseConfig.h
# Opt level: O2

vector<ConfigKey,_std::allocator<ConfigKey>_> * ConfigKey::available(void)

{
  vector<ConfigKey,_std::allocator<ConfigKey>_> *in_RDI;
  long lVar1;
  initializer_list<ConfigKey> __l;
  allocator_type local_169;
  ConfigKey local_168 [6];
  
  query_max_edge();
  query_max_ngram();
  database_workers();
  merge_max_datasets();
  merge_max_files();
  iterator_gc_seconds();
  __l._M_len = 6;
  __l._M_array = local_168;
  std::vector<ConfigKey,_std::allocator<ConfigKey>_>::vector(in_RDI,__l,&local_169);
  lVar1 = 0x118;
  do {
    std::__cxx11::string::~string((string *)((long)&local_168[0].key_._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x38;
  } while (lVar1 != -0x38);
  return in_RDI;
}

Assistant:

static std::vector<ConfigKey> available() {
        return {
            query_max_edge(),     query_max_ngram(), database_workers(),
            merge_max_datasets(), merge_max_files(), iterator_gc_seconds(),
        };
    }